

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

bool __thiscall
icu_63::DecimalFormat::fastFormatInt64(DecimalFormat *this,int64_t input,UnicodeString *output)

{
  bool bVar1;
  
  bVar1 = (bool)(input + 0x7fffffffU < 0xffffffff & this->fields->canUseFastFormat);
  if (bVar1 == true) {
    doFastFormatInt32(this,(int32_t)input,SUB81((ulong)input >> 0x3f,0),output);
  }
  return bVar1;
}

Assistant:

bool DecimalFormat::fastFormatInt64(int64_t input, UnicodeString& output) const {
    if (!fields->canUseFastFormat) {
        return false;
    }
    if (input <= INT32_MIN || input > INT32_MAX) {
        return false;
    }
    doFastFormatInt32(static_cast<int32_t>(input), input < 0, output);
    return true;
}